

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AddNotNull(Parse *pParse,int onError)

{
  byte *pbVar1;
  Table *pTVar2;
  Column *pCVar3;
  uint uVar4;
  Index *pIVar5;
  
  pTVar2 = pParse->pNewTable;
  if ((pTVar2 != (Table *)0x0) && (0 < pTVar2->nCol)) {
    pCVar3 = pTVar2->aCol;
    uVar4 = (int)pTVar2->nCol - 1;
    pCVar3[uVar4].field_0x8 = pCVar3[uVar4].field_0x8 & 0xf0 | (byte)onError & 0xf;
    pbVar1 = (byte *)((long)&pTVar2->tabFlags + 1);
    *pbVar1 = *pbVar1 | 8;
    if ((pCVar3[uVar4].colFlags & 8) != 0) {
      for (pIVar5 = pTVar2->pIndex; pIVar5 != (Index *)0x0; pIVar5 = pIVar5->pNext) {
        if (pTVar2->nCol + -1 == (int)*pIVar5->aiColumn) {
          pIVar5->field_0x63 = pIVar5->field_0x63 | 8;
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddNotNull(Parse *pParse, int onError){
  Table *p;
  Column *pCol;
  p = pParse->pNewTable;
  if( p==0 || NEVER(p->nCol<1) ) return;
  pCol = &p->aCol[p->nCol-1];
  pCol->notNull = (u8)onError;
  p->tabFlags |= TF_HasNotNull;

  /* Set the uniqNotNull flag on any UNIQUE or PK indexes already created
  ** on this column.  */
  if( pCol->colFlags & COLFLAG_UNIQUE ){
    Index *pIdx;
    for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->nKeyCol==1 && pIdx->onError!=OE_None );
      if( pIdx->aiColumn[0]==p->nCol-1 ){
        pIdx->uniqNotNull = 1;
      }
    }
  }
}